

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxDelta(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *val,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *maxabs,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *update,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lowBound,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *upBound,int start,int incr)

{
  int *piVar1;
  cpp_dec_float<50u,int,void> *this_00;
  uint *puVar2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  undefined8 uVar4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  SPxId *pSVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  type_conflict5 tVar10;
  int iVar11;
  int iVar12;
  double *pdVar13;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar14;
  cpp_dec_float<50U,_int,_void> *pcVar15;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *u;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar16;
  long lVar17;
  pointer pnVar18;
  ulong uVar19;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int *local_260;
  cpp_dec_float<50U,_int,_void> local_258;
  int *local_218;
  int local_20c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<50U,_int,_void> local_1c8;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_188;
  undefined4 local_17c;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_178;
  cpp_dec_float<50U,_int,_void> *local_170;
  int *local_168;
  Type local_15c;
  pointer local_158;
  pointer local_150;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  cpp_dec_float<50U,_int,_void> local_108;
  fpclass_type *local_d0;
  fpclass_type *local_c8;
  cpp_dec_float<50u,int,void> *local_c0;
  cpp_dec_float<50U,_int,_void> local_b8;
  cpp_dec_float<50U,_int,_void> local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  
  local_258.fpclass = cpp_dec_float_finite;
  local_258.prec_elem = 10;
  local_258.data._M_elems[0] = 0;
  local_258.data._M_elems[1] = 0;
  local_258.data._M_elems[2] = 0;
  local_258.data._M_elems[3] = 0;
  local_258.data._M_elems[4] = 0;
  local_258.data._M_elems[5] = 0;
  local_258.data._M_elems[6] = 0;
  local_258.data._M_elems[7] = 0;
  local_258.data._M_elems[8] = 0;
  local_258.data._M_elems[9] = 0;
  local_258.exp = 0;
  local_258.neg = false;
  local_108.fpclass = cpp_dec_float_finite;
  local_108.prec_elem = 10;
  local_108.data._M_elems[0] = 0;
  local_108.data._M_elems[1] = 0;
  local_108.data._M_elems[2] = 0;
  local_108.data._M_elems[3] = 0;
  local_108.data._M_elems[4] = 0;
  local_108.data._M_elems[5] = 0;
  local_108.data._M_elems._24_5_ = 0;
  local_108.data._M_elems[7]._1_3_ = 0;
  local_108.data._M_elems._32_5_ = 0;
  local_108.data._M_elems[9]._1_3_ = 0;
  local_108.exp = 0;
  local_108.neg = false;
  local_78.fpclass = cpp_dec_float_finite;
  local_78.prec_elem = 10;
  local_78.data._M_elems[0] = 0;
  local_78.data._M_elems[1] = 0;
  local_78.data._M_elems[2] = 0;
  local_78.data._M_elems[3] = 0;
  local_78.data._M_elems[4] = 0;
  local_78.data._M_elems[5] = 0;
  local_78.data._M_elems._24_5_ = 0;
  local_78.data._M_elems[7]._1_3_ = 0;
  local_78.data._M_elems._32_5_ = 0;
  local_78.data._M_elems[9]._1_3_ = 0;
  local_78.exp = 0;
  local_78.neg = false;
  local_b8.fpclass = cpp_dec_float_finite;
  local_b8.prec_elem = 10;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems._24_5_ = 0;
  local_b8.data._M_elems[7]._1_3_ = 0;
  local_b8.data._M_elems._32_5_ = 0;
  local_b8.data._M_elems[9]._1_3_ = 0;
  local_b8.exp = 0;
  local_b8.neg = false;
  local_15c = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_type;
  if (local_15c == LEAVE) {
    local_17c = 0;
  }
  else {
    pSVar5 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_17c = (undefined4)CONCAT71((int7)((ulong)pSVar5 >> 8),pSVar5->theRep == ROW);
  }
  uVar4 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 8);
  local_1c8.data._M_elems[8] = (uint)uVar4;
  local_1c8.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
  uVar4 = *(undefined8 *)(maxabs->m_backend).data._M_elems;
  uVar7 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 2);
  uVar8 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 4);
  uVar9 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 6);
  local_1c8.data._M_elems[4] = (uint)uVar8;
  local_1c8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
  local_1c8.data._M_elems[6] = (uint)uVar9;
  local_1c8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
  local_1c8.data._M_elems[0] = (uint)uVar4;
  local_1c8.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
  local_1c8.data._M_elems[2] = (uint)uVar7;
  local_1c8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
  local_1c8.exp = (maxabs->m_backend).exp;
  local_1c8.neg = (maxabs->m_backend).neg;
  local_1c8.fpclass = (maxabs->m_backend).fpclass;
  local_1c8.prec_elem = (maxabs->m_backend).prec_elem;
  local_c8 = (fpclass_type *)
             (upBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_d0 = (fpclass_type *)
             (lowBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_158 = (update->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_260 = (update->thedelta).super_IdxSet.idx;
  pnVar18 = (update->thedelta).
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_148.m_backend.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_148.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_148.m_backend.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_148.m_backend.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  local_148.m_backend.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_148.m_backend.exp = (val->m_backend).exp;
  local_148.m_backend.neg = (val->m_backend).neg;
  local_148.m_backend.fpclass = (val->m_backend).fpclass;
  local_148.m_backend.prec_elem = (val->m_backend).prec_elem;
  local_188 = this;
  local_40 = val;
  local_38 = maxabs;
  if ((update->thedelta).setupStatus == true) {
    local_168 = local_260 + (update->thedelta).super_IdxSet.num;
    local_178 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)&this->fastDelta;
    local_c0 = (cpp_dec_float<50u,int,void> *)((long)incr << 2);
    local_20c = -1;
    pSVar16 = this;
    local_150 = pnVar18;
    for (local_260 = local_260 + start; local_260 < local_168;
        local_260 = (int *)((long)local_260 + (long)local_c0)) {
      iVar12 = *local_260;
      if (local_15c == LEAVE) {
        pSVar5 = (pSVar16->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        if (pSVar16->iscoid == true) {
          pDVar14 = (pSVar5->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.costat;
        }
        else {
          pDVar14 = (pSVar5->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.stat;
        }
        if (pSVar5->theRep * pDVar14->data[iVar12] < 1) goto LAB_00244d40;
      }
      else {
LAB_00244d40:
        local_170 = (cpp_dec_float<50U,_int,_void> *)CONCAT44(local_170._4_4_,iVar12);
        if ((char)local_17c != '\0') {
          pSVar5 = (pSVar16->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          pSVar6 = (pSVar5->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < pSVar6[iVar12].super_DataKey.info) {
            SPxColId::SPxColId((SPxColId *)&result,pSVar6 + iVar12);
            pSVar16 = local_188;
            iVar11 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar5->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)&result);
            if ((pSVar5->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar11] == P_FIXED) goto LAB_002455b0;
          }
        }
        uVar4 = *(undefined8 *)((long)&pnVar18[iVar12].m_backend.data + 0x20);
        local_258.data._M_elems[8] = (uint)uVar4;
        local_258.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)&pnVar18[iVar12].m_backend.data;
        uVar7 = *(undefined8 *)((long)&pnVar18[iVar12].m_backend.data + 8);
        puVar2 = (uint *)((long)&pnVar18[iVar12].m_backend.data + 0x10);
        uVar8 = *(undefined8 *)puVar2;
        uVar9 = *(undefined8 *)(puVar2 + 2);
        local_258.data._M_elems[4] = (uint)uVar8;
        local_258.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
        local_258.data._M_elems[6] = (uint)uVar9;
        local_258.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
        local_258.data._M_elems[0] = (uint)uVar4;
        local_258.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
        local_258.data._M_elems[2] = (uint)uVar7;
        local_258.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
        local_258.exp = pnVar18[iVar12].m_backend.exp;
        local_258.neg = pnVar18[iVar12].m_backend.neg;
        local_258.fpclass = pnVar18[iVar12].m_backend.fpclass;
        local_258.prec_elem = pnVar18[iVar12].m_backend.prec_elem;
        uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
        result.m_backend.data._M_elems._32_5_ = SUB85(uVar4,0);
        result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        result.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(this->epsilon).m_backend.data._M_elems;
        result.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
        result.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
        uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
        result.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
        result.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        result.m_backend.exp = (pSVar16->epsilon).m_backend.exp;
        result.m_backend.neg = (pSVar16->epsilon).m_backend.neg;
        result.m_backend.fpclass = (pSVar16->epsilon).m_backend.fpclass;
        result.m_backend.prec_elem = (pSVar16->epsilon).m_backend.prec_elem;
        local_218 = local_260;
        tVar10 = boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_258,&result);
        if (tVar10) {
          tVar10 = boost::multiprecision::operator>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_258,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_1c8);
          pcVar15 = &local_1c8;
          if (tVar10) {
            pcVar15 = &local_258;
          }
          uVar4 = *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar15->data)->data)._M_elems;
          uVar7 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)&pcVar15->data)->data)._M_elems + 2);
          uVar8 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)&pcVar15->data)->data)._M_elems + 4);
          uVar9 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)&pcVar15->data)->data)._M_elems + 6);
          local_1c8.data._M_elems[0] = (uint)uVar4;
          local_1c8.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
          local_1c8.data._M_elems[2] = (uint)uVar7;
          local_1c8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
          local_1c8.data._M_elems[4] = (uint)uVar8;
          local_1c8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
          local_1c8.data._M_elems[6] = (uint)uVar9;
          local_1c8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
          uVar4 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)&pcVar15->data)->data)._M_elems + 8);
          local_1c8.data._M_elems[8] = (uint)uVar4;
          local_1c8.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
          pcVar15 = &local_1c8;
          if (tVar10) {
            pcVar15 = &local_258;
          }
          local_1c8.exp = pcVar15->exp;
          pcVar15 = &local_1c8;
          if (tVar10) {
            pcVar15 = &local_258;
          }
          local_1c8.neg = pcVar15->neg;
          uVar19 = CONCAT44((int)((uint)tVar10 << 0x1f) >> 0x1f,(int)((uint)tVar10 << 0x1f) >> 0x1f)
          ;
          local_1c8._48_8_ = ~uVar19 & local_1c8._48_8_ | local_258._48_8_ & uVar19;
          puVar2 = (uint *)((long)&(((pointer)((long)local_c8 + (long)iVar12 * 0x38))->m_backend).
                                   data + 0x10);
          local_78.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          uVar4 = *(undefined8 *)(puVar2 + 2);
          local_78.data._M_elems._24_5_ = SUB85(uVar4,0);
          local_78.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          uVar4 = *(undefined8 *)
                   ((long)&(((pointer)((long)local_c8 + (long)iVar12 * 0x38))->m_backend).data +
                   0x20);
          local_78.data._M_elems._32_5_ = SUB85(uVar4,0);
          local_78.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          local_78.data._M_elems._0_8_ =
               *(undefined8 *)&(((pointer)((long)local_c8 + (long)iVar12 * 0x38))->m_backend).data;
          local_78.data._M_elems._8_8_ =
               *(undefined8 *)
                ((long)&(((pointer)((long)local_c8 + (long)iVar12 * 0x38))->m_backend).data + 8);
          local_78.exp = (((pointer)((long)local_c8 + (long)iVar12 * 0x38))->m_backend).exp;
          local_78.neg = (((pointer)((long)local_c8 + (long)iVar12 * 0x38))->m_backend).neg;
          local_78.fpclass = (((pointer)((long)local_c8 + (long)iVar12 * 0x38))->m_backend).fpclass;
          local_78.prec_elem =
               (((pointer)((long)local_c8 + (long)iVar12 * 0x38))->m_backend).prec_elem;
          pdVar13 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&result.m_backend,*pdVar13,(type *)0x0);
          tVar10 = boost::multiprecision::operator<
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_78,&result);
          local_260 = local_218;
          pnVar18 = local_150;
          if (tVar10) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems._24_5_ = 0;
            result.m_backend.data._M_elems[7]._1_3_ = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend.data._M_elems[9]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result.m_backend,&local_78,&local_158[iVar12].m_backend);
            local_108.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
            local_108.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
            local_108.data._M_elems[4] = result.m_backend.data._M_elems[4];
            local_108.data._M_elems[5] = result.m_backend.data._M_elems[5];
            local_108.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
            local_108.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
            local_108.data._M_elems[0] = result.m_backend.data._M_elems[0];
            local_108.data._M_elems[1] = result.m_backend.data._M_elems[1];
            local_108.data._M_elems[2] = result.m_backend.data._M_elems[2];
            local_108.data._M_elems[3] = result.m_backend.data._M_elems[3];
            local_108.exp = result.m_backend.exp;
            local_108.neg = result.m_backend.neg;
            local_108.fpclass = result.m_backend.fpclass;
            local_108.prec_elem = result.m_backend.prec_elem;
            result.m_backend.data._M_elems._0_8_ =
                 result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
            tVar10 = boost::multiprecision::operator<=
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_108,(int *)&result);
            pnVar18 = local_150;
            u = local_178;
            if (!tVar10) {
              result_2.m_backend.fpclass = cpp_dec_float_finite;
              result_2.m_backend.prec_elem = 10;
              result_2.m_backend.data._M_elems[0] = 0;
              result_2.m_backend.data._M_elems[1] = 0;
              result_2.m_backend.data._M_elems[2] = 0;
              result_2.m_backend.data._M_elems[3] = 0;
              result_2.m_backend.data._M_elems[4] = 0;
              result_2.m_backend.data._M_elems[5] = 0;
              result_2.m_backend.data._M_elems._24_5_ = 0;
              result_2.m_backend.data._M_elems[7]._1_3_ = 0;
              result_2.m_backend.data._M_elems[8] = 0;
              result_2.m_backend.data._M_elems[9] = 0;
              result_2.m_backend.exp = 0;
              result_2.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result_2.m_backend,&local_108,(cpp_dec_float<50U,_int,_void> *)local_178);
              u = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&result_2.m_backend;
            }
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.neg = false;
            result.m_backend.exp = 0;
            result.m_backend.data._M_elems[9]._1_3_ = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend.data._M_elems[7]._1_3_ = 0;
            result.m_backend.data._M_elems._24_5_ = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            boost::multiprecision::default_ops::
            eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result.m_backend,(cpp_dec_float<50U,_int,_void> *)u,&local_258);
            local_258.data._M_elems[8] = result.m_backend.data._M_elems[8];
            local_258.data._M_elems[9] =
                 (uint)(CONCAT35(result.m_backend.data._M_elems[9]._1_3_,
                                 result.m_backend.data._M_elems._32_5_) >> 0x20);
            local_258.data._M_elems[4] = result.m_backend.data._M_elems[4];
            local_258.data._M_elems[5] = result.m_backend.data._M_elems[5];
            local_258.data._M_elems[6] = result.m_backend.data._M_elems[6];
            local_258.data._M_elems[7] =
                 (uint)(CONCAT35(result.m_backend.data._M_elems[7]._1_3_,
                                 result.m_backend.data._M_elems._24_5_) >> 0x20);
            local_258.data._M_elems[0] = result.m_backend.data._M_elems[0];
            local_258.data._M_elems[1] = result.m_backend.data._M_elems[1];
            local_258.data._M_elems[2] = result.m_backend.data._M_elems[2];
            local_258.data._M_elems[3] = result.m_backend.data._M_elems[3];
            local_258.exp = result.m_backend.exp;
            local_258.neg = result.m_backend.neg;
            local_258.fpclass = result.m_backend.fpclass;
            local_258.prec_elem = result.m_backend.prec_elem;
            tVar10 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_258,&local_148);
            pSVar16 = local_188;
LAB_0024554f:
            if (tVar10 != false) {
              local_148.m_backend.data._M_elems[9] = local_258.data._M_elems[9];
              local_148.m_backend.data._M_elems[8] = local_258.data._M_elems[8];
              local_148.m_backend.data._M_elems[1] = local_258.data._M_elems[1];
              local_148.m_backend.data._M_elems[0] = local_258.data._M_elems[0];
              local_148.m_backend.data._M_elems[3] = local_258.data._M_elems[3];
              local_148.m_backend.data._M_elems[2] = local_258.data._M_elems[2];
              local_148.m_backend.data._M_elems[5] = local_258.data._M_elems[5];
              local_148.m_backend.data._M_elems[4] = local_258.data._M_elems[4];
              local_148.m_backend.data._M_elems[7] = local_258.data._M_elems[7];
              local_148.m_backend.data._M_elems[6] = local_258.data._M_elems[6];
              local_148.m_backend.exp = local_258.exp;
              local_148.m_backend.neg = local_258.neg;
              local_148.m_backend.fpclass = local_258.fpclass;
              local_148.m_backend.prec_elem = local_258.prec_elem;
              local_20c = (int)local_170;
            }
          }
        }
        else {
          uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
          result.m_backend.data._M_elems._32_5_ = SUB85(uVar4,0);
          result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          result.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(this->epsilon).m_backend.data._M_elems;
          result.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
          result.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
          uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
          result.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
          result.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          result.m_backend.exp = (pSVar16->epsilon).m_backend.exp;
          result.m_backend.neg = (pSVar16->epsilon).m_backend.neg;
          result.m_backend.fpclass = (pSVar16->epsilon).m_backend.fpclass;
          result.m_backend.prec_elem = (pSVar16->epsilon).m_backend.prec_elem;
          if (result.m_backend.fpclass != cpp_dec_float_finite ||
              result.m_backend.data._M_elems[0] != 0) {
            result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
          }
          tVar10 = boost::multiprecision::operator<
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_258,&result);
          pnVar18 = local_150;
          local_260 = local_218;
          if (tVar10) {
            result.m_backend.data._M_elems[1] = local_258.data._M_elems[1];
            result.m_backend.data._M_elems[0] = local_258.data._M_elems[0];
            result.m_backend.data._M_elems[3] = local_258.data._M_elems[3];
            result.m_backend.data._M_elems[2] = local_258.data._M_elems[2];
            result.m_backend.data._M_elems[5] = local_258.data._M_elems[5];
            result.m_backend.data._M_elems[4] = local_258.data._M_elems[4];
            result.m_backend.data._M_elems._32_5_ =
                 SUB85(CONCAT44(local_258.data._M_elems[9],local_258.data._M_elems[8]),0);
            result.m_backend.data._M_elems[9]._1_3_ = (undefined3)(local_258.data._M_elems[9] >> 8);
            result.m_backend.data._M_elems._24_5_ =
                 SUB85(CONCAT44(local_258.data._M_elems[7],local_258.data._M_elems[6]),0);
            result.m_backend.data._M_elems[7]._1_3_ = (undefined3)(local_258.data._M_elems[7] >> 8);
            result.m_backend.exp = local_258.exp;
            result.m_backend.neg = local_258.neg;
            result.m_backend.fpclass = local_258.fpclass;
            result.m_backend.prec_elem = local_258.prec_elem;
            if (local_258.fpclass != cpp_dec_float_finite || local_258.data._M_elems[0] != 0) {
              result.m_backend.neg = (bool)(local_258.neg ^ 1);
            }
            tVar10 = boost::multiprecision::operator>
                               (&result,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&local_1c8);
            if (tVar10) {
              result_2.m_backend.data._M_elems[1] = local_258.data._M_elems[2];
              result_2.m_backend.data._M_elems[0] = local_258.data._M_elems[1];
              result_2.m_backend.data._M_elems[3] = local_258.data._M_elems[4];
              result_2.m_backend.data._M_elems[2] = local_258.data._M_elems[3];
              result_2.m_backend.data._M_elems[5] = local_258.data._M_elems[6];
              result_2.m_backend.data._M_elems[4] = local_258.data._M_elems[5];
              result_2.m_backend.data._M_elems._24_5_ =
                   SUB85(CONCAT44(local_258.data._M_elems[8],local_258.data._M_elems[7]),0);
              result_2.m_backend.data._M_elems[7]._1_3_ =
                   (undefined3)(local_258.data._M_elems[8] >> 8);
              result_2.m_backend.data._M_elems[8] = local_258.data._M_elems[9];
              local_1c8.exp = local_258.exp;
              local_1c8.prec_elem = local_258.prec_elem;
              if (local_258.fpclass == cpp_dec_float_finite && local_258.data._M_elems[0] == 0) {
                local_1c8.neg = local_258.neg;
                local_1c8.data._M_elems[0] = 0;
                local_1c8.fpclass = cpp_dec_float_finite;
              }
              else {
                local_1c8.neg = (bool)(local_258.neg ^ 1);
                local_1c8.data._M_elems[0] = local_258.data._M_elems[0];
                local_1c8.fpclass = local_258.fpclass;
              }
            }
            else {
              result_2.m_backend.data._M_elems[1] = local_1c8.data._M_elems[2];
              result_2.m_backend.data._M_elems[0] = local_1c8.data._M_elems[1];
              result_2.m_backend.data._M_elems[3] = local_1c8.data._M_elems[4];
              result_2.m_backend.data._M_elems[2] = local_1c8.data._M_elems[3];
              result_2.m_backend.data._M_elems[5] = local_1c8.data._M_elems[6];
              result_2.m_backend.data._M_elems[4] = local_1c8.data._M_elems[5];
              result_2.m_backend.data._M_elems._24_5_ =
                   SUB85(CONCAT44(local_1c8.data._M_elems[8],local_1c8.data._M_elems[7]),0);
              result_2.m_backend.data._M_elems[7]._1_3_ =
                   (undefined3)(local_1c8.data._M_elems[8] >> 8);
              result_2.m_backend.data._M_elems[8] = local_1c8.data._M_elems[9];
            }
            local_1c8.data._M_elems[9] = result_2.m_backend.data._M_elems[8];
            local_1c8.data._M_elems[5] = result_2.m_backend.data._M_elems[4];
            local_1c8.data._M_elems[6] = result_2.m_backend.data._M_elems[5];
            local_1c8.data._M_elems[7] = result_2.m_backend.data._M_elems[6];
            local_1c8.data._M_elems[8] =
                 (uint)(CONCAT35(result_2.m_backend.data._M_elems[7]._1_3_,
                                 result_2.m_backend.data._M_elems._24_5_) >> 0x20);
            local_1c8.data._M_elems[1] = result_2.m_backend.data._M_elems[0];
            local_1c8.data._M_elems[2] = result_2.m_backend.data._M_elems[1];
            local_1c8.data._M_elems[3] = result_2.m_backend.data._M_elems[2];
            local_1c8.data._M_elems[4] = result_2.m_backend.data._M_elems[3];
            local_b8.data._M_elems._0_8_ =
                 *(undefined8 *)&(((pointer)((long)local_d0 + (long)iVar12 * 0x38))->m_backend).data
            ;
            local_b8.data._M_elems._8_8_ =
                 *(undefined8 *)
                  ((long)&(((pointer)((long)local_d0 + (long)iVar12 * 0x38))->m_backend).data + 8);
            puVar2 = (uint *)((long)&(((pointer)((long)local_d0 + (long)iVar12 * 0x38))->m_backend).
                                     data + 0x10);
            local_b8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            uVar4 = *(undefined8 *)(puVar2 + 2);
            local_b8.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            uVar4 = *(undefined8 *)
                     ((long)&(((pointer)((long)local_d0 + (long)iVar12 * 0x38))->m_backend).data +
                     0x20);
            local_b8.data._M_elems._32_5_ = SUB85(uVar4,0);
            local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_b8.exp = (((pointer)((long)local_d0 + (long)iVar12 * 0x38))->m_backend).exp;
            local_b8.neg = (((pointer)((long)local_d0 + (long)iVar12 * 0x38))->m_backend).neg;
            local_b8.fpclass =
                 (((pointer)((long)local_d0 + (long)iVar12 * 0x38))->m_backend).fpclass;
            local_b8.prec_elem =
                 (((pointer)((long)local_d0 + (long)iVar12 * 0x38))->m_backend).prec_elem;
            pdVar13 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&result.m_backend,-*pdVar13,(type *)0x0);
            tVar10 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_b8,&result);
            if (tVar10) {
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 10;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems._24_5_ = 0;
              result.m_backend.data._M_elems[7]._1_3_ = 0;
              result.m_backend.data._M_elems._32_5_ = 0;
              result.m_backend.data._M_elems[9]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result.m_backend,&local_b8,&local_158[iVar12].m_backend);
              local_108.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
              local_108.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
              local_108.data._M_elems[4] = result.m_backend.data._M_elems[4];
              local_108.data._M_elems[5] = result.m_backend.data._M_elems[5];
              local_108.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
              local_108.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
              local_108.data._M_elems[0] = result.m_backend.data._M_elems[0];
              local_108.data._M_elems[1] = result.m_backend.data._M_elems[1];
              local_108.data._M_elems[2] = result.m_backend.data._M_elems[2];
              local_108.data._M_elems[3] = result.m_backend.data._M_elems[3];
              local_108.exp = result.m_backend.exp;
              local_108.neg = result.m_backend.neg;
              local_108.fpclass = result.m_backend.fpclass;
              local_108.prec_elem = result.m_backend.prec_elem;
              result.m_backend.data._M_elems._0_8_ =
                   result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
              tVar10 = boost::multiprecision::operator>=
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_108,(int *)&result);
              if (tVar10) {
                uVar4 = *(undefined8 *)
                         (((array_type *)
                          &local_178->
                           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          )->_M_elems + 8);
                result_2.m_backend.data._M_elems[8] = (uint)uVar4;
                result_2.m_backend.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
                result_2.m_backend.data._M_elems._0_8_ =
                     *(undefined8 *)
                      ((array_type *)
                      &local_178->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      )->_M_elems;
                result_2.m_backend.data._M_elems._8_8_ =
                     *(undefined8 *)
                      (((array_type *)
                       &local_178->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )->_M_elems + 2);
                result_2.m_backend.data._M_elems._16_8_ =
                     *(undefined8 *)
                      (((array_type *)
                       &local_178->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )->_M_elems + 4);
                uVar4 = *(undefined8 *)
                         (((array_type *)
                          &local_178->
                           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          )->_M_elems + 6);
                result_2.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
                result_2.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                result_2.m_backend.exp = (pSVar16->fastDelta).m_backend.exp;
                result_2.m_backend.neg = (pSVar16->fastDelta).m_backend.neg;
                result_2.m_backend.fpclass = (pSVar16->fastDelta).m_backend.fpclass;
                result_2.m_backend.prec_elem = (pSVar16->fastDelta).m_backend.prec_elem;
                if (result_2.m_backend.fpclass != cpp_dec_float_finite ||
                    result_2.m_backend.data._M_elems[0] != 0) {
                  result_2.m_backend.neg = (bool)(result_2.m_backend.neg ^ 1);
                }
              }
              else {
                result_2.m_backend.fpclass = cpp_dec_float_finite;
                result_2.m_backend.prec_elem = 10;
                result_2.m_backend.data._M_elems[0] = 0;
                result_2.m_backend.data._M_elems[1] = 0;
                result_2.m_backend.data._M_elems[2] = 0;
                result_2.m_backend.data._M_elems[3] = 0;
                result_2.m_backend.data._M_elems[4] = 0;
                result_2.m_backend.data._M_elems[5] = 0;
                result_2.m_backend.data._M_elems._24_5_ = 0;
                result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                result_2.m_backend.data._M_elems[8] = 0;
                result_2.m_backend.data._M_elems[9] = 0;
                result_2.m_backend.exp = 0;
                result_2.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (&result_2.m_backend,&local_108,(cpp_dec_float<50U,_int,_void> *)local_178
                          );
              }
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 10;
              result.m_backend.neg = false;
              result.m_backend.exp = 0;
              result.m_backend.data._M_elems[9]._1_3_ = 0;
              result.m_backend.data._M_elems._32_5_ = 0;
              result.m_backend.data._M_elems[7]._1_3_ = 0;
              result.m_backend.data._M_elems._24_5_ = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              boost::multiprecision::default_ops::
              eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result.m_backend,&result_2.m_backend,&local_258);
              local_258.data._M_elems[8] = result.m_backend.data._M_elems[8];
              local_258.data._M_elems[9] =
                   (uint)(CONCAT35(result.m_backend.data._M_elems[9]._1_3_,
                                   result.m_backend.data._M_elems._32_5_) >> 0x20);
              local_258.data._M_elems[4] = result.m_backend.data._M_elems[4];
              local_258.data._M_elems[5] = result.m_backend.data._M_elems[5];
              local_258.data._M_elems[6] = result.m_backend.data._M_elems[6];
              local_258.data._M_elems[7] =
                   (uint)(CONCAT35(result.m_backend.data._M_elems[7]._1_3_,
                                   result.m_backend.data._M_elems._24_5_) >> 0x20);
              local_258.data._M_elems[0] = result.m_backend.data._M_elems[0];
              local_258.data._M_elems[1] = result.m_backend.data._M_elems[1];
              local_258.data._M_elems[2] = result.m_backend.data._M_elems[2];
              local_258.data._M_elems[3] = result.m_backend.data._M_elems[3];
              local_258.exp = result.m_backend.exp;
              local_258.neg = result.m_backend.neg;
              local_258.fpclass = result.m_backend.fpclass;
              local_258.prec_elem = result.m_backend.prec_elem;
              tVar10 = boost::multiprecision::operator<
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_258,&local_148);
              goto LAB_0024554f;
            }
          }
        }
      }
LAB_002455b0:
    }
  }
  else {
    local_20c = -1;
    (update->thedelta).setupStatus = false;
    local_c0 = (cpp_dec_float<50u,int,void> *)
               (pnVar18 +
               (int)(((long)(update->
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)local_158) / 0x38));
    pnVar3 = &this->epsilon;
    local_170 = &(this->fastDelta).m_backend;
    local_c8 = &(((pointer)local_c8)->m_backend).fpclass;
    local_d0 = &(((pointer)local_d0)->m_backend).fpclass;
    local_168 = (int *)0x0;
    local_218 = (int *)0x0;
    local_178 = update;
    for (lVar17 = 0;
        this_00 = (cpp_dec_float<50u,int,void> *)((long)&(pnVar18->m_backend).data + lVar17),
        this_00 < local_c0; lVar17 = lVar17 + 0x38) {
      local_258.data._M_elems[8] = (uint)*(undefined8 *)(this_00 + 0x20);
      local_258.data._M_elems[9] = (uint)((ulong)*(undefined8 *)(this_00 + 0x20) >> 0x20);
      local_258.data._M_elems[4] = (uint)*(undefined8 *)(this_00 + 0x10);
      local_258.data._M_elems[5] = (uint)((ulong)*(undefined8 *)(this_00 + 0x10) >> 0x20);
      local_258.data._M_elems[6] = (uint)*(undefined8 *)(this_00 + 0x18);
      local_258.data._M_elems[7] = (uint)((ulong)*(undefined8 *)(this_00 + 0x18) >> 0x20);
      local_258.data._M_elems[0] = (uint)*(undefined8 *)this_00;
      local_258.data._M_elems[1] = (uint)((ulong)*(undefined8 *)this_00 >> 0x20);
      local_258.data._M_elems[2] = (uint)*(undefined8 *)(this_00 + 8);
      local_258.data._M_elems[3] = (uint)((ulong)*(undefined8 *)(this_00 + 8) >> 0x20);
      local_258.exp = *(int *)((long)&(pnVar18->m_backend).data + lVar17 + 0x28);
      local_258.neg = *(bool *)((long)&(pnVar18->m_backend).data + lVar17 + 0x2c);
      local_258._48_8_ = *(ulong *)((long)&(pnVar18->m_backend).data + lVar17 + 0x30);
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      tVar10 = boost::multiprecision::operator!=
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_258,(double *)&result);
      pSVar16 = local_188;
      if (tVar10) {
        uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
        result.m_backend.data._M_elems._32_5_ = SUB85(uVar4,0);
        result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar3->m_backend).data._M_elems;
        result.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
        result.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
        uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
        result.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
        result.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        result.m_backend.exp = (local_188->epsilon).m_backend.exp;
        result.m_backend.neg = (local_188->epsilon).m_backend.neg;
        result.m_backend.fpclass = (local_188->epsilon).m_backend.fpclass;
        result.m_backend.prec_elem = (local_188->epsilon).m_backend.prec_elem;
        if (result.m_backend.fpclass != cpp_dec_float_finite ||
            result.m_backend.data._M_elems[0] != 0) {
          result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
        }
        tVar10 = boost::multiprecision::operator>=
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_258,&result);
        if (tVar10) {
          uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
          result_2.m_backend.data._M_elems[8] = (uint)uVar4;
          result_2.m_backend.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
          result_2.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar3->m_backend).data._M_elems;
          result_2.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
          result_2.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
          uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
          result_2.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
          result_2.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          result_2.m_backend.exp = (pSVar16->epsilon).m_backend.exp;
          result_2.m_backend.neg = (pSVar16->epsilon).m_backend.neg;
          result_2.m_backend.fpclass = (pSVar16->epsilon).m_backend.fpclass;
          result_2.m_backend.prec_elem = (pSVar16->epsilon).m_backend.prec_elem;
          tVar10 = boost::multiprecision::operator<=
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_258,&result_2);
          if (tVar10) {
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(this_00,0.0);
            goto LAB_002460a3;
          }
        }
        piVar1 = local_260 + 1;
        *local_260 = (int)local_218;
        local_260 = piVar1;
        if (local_15c == LEAVE) {
          pSVar5 = (local_188->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          if (local_188->iscoid == true) {
            pDVar14 = (pSVar5->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.costat;
          }
          else {
            pDVar14 = (pSVar5->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.stat;
          }
          if (0 < pSVar5->theRep * pDVar14->data[(long)local_218]) goto LAB_002460a3;
        }
        if ((char)local_17c != '\0') {
          pSVar5 = (local_188->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          pSVar6 = (pSVar5->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < *(int *)((long)&(pSVar6->super_DataKey).info + (long)local_168)) {
            SPxColId::SPxColId((SPxColId *)&result,
                               (SPxId *)((long)&(pSVar6->super_DataKey).info + (long)local_168));
            iVar12 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar5->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)&result);
            if ((pSVar5->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar12] == P_FIXED) goto LAB_002460a3;
          }
        }
        pSVar16 = local_188;
        uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
        result.m_backend.data._M_elems._32_5_ = SUB85(uVar4,0);
        result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar3->m_backend).data._M_elems;
        result.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
        result.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
        uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
        result.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
        result.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        result.m_backend.exp = (local_188->epsilon).m_backend.exp;
        result.m_backend.neg = (local_188->epsilon).m_backend.neg;
        result.m_backend.fpclass = (local_188->epsilon).m_backend.fpclass;
        result.m_backend.prec_elem = (local_188->epsilon).m_backend.prec_elem;
        tVar10 = boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_258,&result);
        if (tVar10) {
          tVar10 = boost::multiprecision::operator>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_258,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_1c8);
          pcVar15 = &local_1c8;
          if (tVar10) {
            pcVar15 = &local_258;
          }
          uVar4 = *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar15->data)->data)._M_elems;
          uVar7 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)&pcVar15->data)->data)._M_elems + 2);
          uVar8 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)&pcVar15->data)->data)._M_elems + 4);
          uVar9 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)&pcVar15->data)->data)._M_elems + 6);
          local_1c8.data._M_elems[0] = (uint)uVar4;
          local_1c8.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
          local_1c8.data._M_elems[2] = (uint)uVar7;
          local_1c8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
          local_1c8.data._M_elems[4] = (uint)uVar8;
          local_1c8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
          local_1c8.data._M_elems[6] = (uint)uVar9;
          local_1c8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
          uVar4 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)&pcVar15->data)->data)._M_elems + 8);
          local_1c8.data._M_elems[8] = (uint)uVar4;
          local_1c8.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
          pcVar15 = &local_1c8;
          if (tVar10) {
            pcVar15 = &local_258;
          }
          local_1c8.exp = pcVar15->exp;
          pcVar15 = &local_1c8;
          if (tVar10) {
            pcVar15 = &local_258;
          }
          local_1c8.neg = pcVar15->neg;
          uVar19 = CONCAT44((int)((uint)tVar10 << 0x1f) >> 0x1f,(int)((uint)tVar10 << 0x1f) >> 0x1f)
          ;
          local_1c8._48_8_ = ~uVar19 & local_1c8._48_8_ | local_258._48_8_ & uVar19;
          puVar2 = (uint *)((long)local_c8 + lVar17 + -0x20);
          local_78.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          uVar4 = *(undefined8 *)(puVar2 + 2);
          local_78.data._M_elems._24_5_ = SUB85(uVar4,0);
          local_78.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          uVar4 = *(undefined8 *)((long)local_c8 + lVar17 + -0x10);
          local_78.data._M_elems._32_5_ = SUB85(uVar4,0);
          local_78.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          puVar2 = (uint *)((long)local_c8 + lVar17 + -0x30);
          local_78.data._M_elems._0_8_ = *(undefined8 *)puVar2;
          local_78.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
          local_78.exp = *(int *)((long)local_c8 + lVar17 + -8);
          local_78.neg = *(bool *)((long)local_c8 + lVar17 + -4);
          local_78._48_8_ = *(undefined8 *)((long)local_c8 + lVar17);
          pdVar13 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&result.m_backend,*pdVar13,(type *)0x0);
          tVar10 = boost::multiprecision::operator<
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_78,&result);
          if (tVar10) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems._24_5_ = 0;
            result.m_backend.data._M_elems[7]._1_3_ = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend.data._M_elems[9]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result.m_backend,&local_78,
                       (cpp_dec_float<50U,_int,_void> *)((long)&local_158->m_backend + lVar17));
            local_108.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
            local_108.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
            local_108.data._M_elems[4] = result.m_backend.data._M_elems[4];
            local_108.data._M_elems[5] = result.m_backend.data._M_elems[5];
            local_108.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
            local_108.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
            local_108.data._M_elems[0] = result.m_backend.data._M_elems[0];
            local_108.data._M_elems[1] = result.m_backend.data._M_elems[1];
            local_108.data._M_elems[2] = result.m_backend.data._M_elems[2];
            local_108.data._M_elems[3] = result.m_backend.data._M_elems[3];
            local_108.exp = result.m_backend.exp;
            local_108.neg = result.m_backend.neg;
            local_108.fpclass = result.m_backend.fpclass;
            local_108.prec_elem = result.m_backend.prec_elem;
            result.m_backend.data._M_elems._0_8_ =
                 result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
            tVar10 = boost::multiprecision::operator<=
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_108,(int *)&result);
            pcVar15 = local_170;
            if (!tVar10) {
              result_2.m_backend.fpclass = cpp_dec_float_finite;
              result_2.m_backend.prec_elem = 10;
              result_2.m_backend.data._M_elems[0] = 0;
              result_2.m_backend.data._M_elems[1] = 0;
              result_2.m_backend.data._M_elems[2] = 0;
              result_2.m_backend.data._M_elems[3] = 0;
              result_2.m_backend.data._M_elems[4] = 0;
              result_2.m_backend.data._M_elems[5] = 0;
              result_2.m_backend.data._M_elems._24_5_ = 0;
              result_2.m_backend.data._M_elems[7]._1_3_ = 0;
              result_2.m_backend.data._M_elems[8] = 0;
              result_2.m_backend.data._M_elems[9] = 0;
              result_2.m_backend.exp = 0;
              result_2.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result_2.m_backend,&local_108,local_170);
              pcVar15 = &result_2.m_backend;
            }
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.neg = false;
            result.m_backend.exp = 0;
            result.m_backend.data._M_elems[9]._1_3_ = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend.data._M_elems[7]._1_3_ = 0;
            result.m_backend.data._M_elems._24_5_ = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            boost::multiprecision::default_ops::
            eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result.m_backend,pcVar15,&local_258);
            local_258.data._M_elems[8] = result.m_backend.data._M_elems[8];
            local_258.data._M_elems[9] =
                 (uint)(CONCAT35(result.m_backend.data._M_elems[9]._1_3_,
                                 result.m_backend.data._M_elems._32_5_) >> 0x20);
            local_258.data._M_elems[4] = result.m_backend.data._M_elems[4];
            local_258.data._M_elems[5] = result.m_backend.data._M_elems[5];
            local_258.data._M_elems[6] = result.m_backend.data._M_elems[6];
            local_258.data._M_elems[7] =
                 (uint)(CONCAT35(result.m_backend.data._M_elems[7]._1_3_,
                                 result.m_backend.data._M_elems._24_5_) >> 0x20);
            local_258.data._M_elems[0] = result.m_backend.data._M_elems[0];
            local_258.data._M_elems[1] = result.m_backend.data._M_elems[1];
            local_258.data._M_elems[2] = result.m_backend.data._M_elems[2];
            local_258.data._M_elems[3] = result.m_backend.data._M_elems[3];
            local_258.exp = result.m_backend.exp;
            local_258.neg = result.m_backend.neg;
            local_258.fpclass = result.m_backend.fpclass;
            local_258.prec_elem = result.m_backend.prec_elem;
            tVar10 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_258,&local_148);
            if (tVar10) {
              local_148.m_backend.data._M_elems[9] = local_258.data._M_elems[9];
              local_148.m_backend.data._M_elems[8] = local_258.data._M_elems[8];
              local_148.m_backend.data._M_elems[1] = local_258.data._M_elems[1];
              local_148.m_backend.data._M_elems[0] = local_258.data._M_elems[0];
              local_148.m_backend.data._M_elems[3] = local_258.data._M_elems[3];
              local_148.m_backend.data._M_elems[2] = local_258.data._M_elems[2];
              local_148.m_backend.data._M_elems[5] = local_258.data._M_elems[5];
              local_148.m_backend.data._M_elems[4] = local_258.data._M_elems[4];
              local_148.m_backend.data._M_elems[7] = local_258.data._M_elems[7];
              local_148.m_backend.data._M_elems[6] = local_258.data._M_elems[6];
              local_148.m_backend.exp = local_258.exp;
              local_148.m_backend.neg = local_258.neg;
              local_148.m_backend.fpclass = local_258.fpclass;
              local_148.m_backend.prec_elem = local_258.prec_elem;
              local_20c = (int)local_218;
            }
          }
        }
        else {
          uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
          result.m_backend.data._M_elems._32_5_ = SUB85(uVar4,0);
          result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar3->m_backend).data._M_elems;
          result.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
          result.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
          uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
          result.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
          result.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          result.m_backend.exp = (pSVar16->epsilon).m_backend.exp;
          result.m_backend.neg = (pSVar16->epsilon).m_backend.neg;
          result.m_backend.fpclass = (pSVar16->epsilon).m_backend.fpclass;
          result.m_backend.prec_elem = (pSVar16->epsilon).m_backend.prec_elem;
          if (result.m_backend.fpclass != cpp_dec_float_finite ||
              result.m_backend.data._M_elems[0] != 0) {
            result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
          }
          tVar10 = boost::multiprecision::operator<
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_258,&result);
          if (tVar10) {
            result.m_backend.data._M_elems[1] = local_258.data._M_elems[1];
            result.m_backend.data._M_elems[0] = local_258.data._M_elems[0];
            result.m_backend.data._M_elems[3] = local_258.data._M_elems[3];
            result.m_backend.data._M_elems[2] = local_258.data._M_elems[2];
            result.m_backend.data._M_elems[5] = local_258.data._M_elems[5];
            result.m_backend.data._M_elems[4] = local_258.data._M_elems[4];
            result.m_backend.data._M_elems._32_5_ =
                 SUB85(CONCAT44(local_258.data._M_elems[9],local_258.data._M_elems[8]),0);
            result.m_backend.data._M_elems[9]._1_3_ = (undefined3)(local_258.data._M_elems[9] >> 8);
            result.m_backend.data._M_elems._24_5_ =
                 SUB85(CONCAT44(local_258.data._M_elems[7],local_258.data._M_elems[6]),0);
            result.m_backend.data._M_elems[7]._1_3_ = (undefined3)(local_258.data._M_elems[7] >> 8);
            result.m_backend.exp = local_258.exp;
            result.m_backend.neg = local_258.neg;
            result.m_backend.fpclass = local_258.fpclass;
            result.m_backend.prec_elem = local_258.prec_elem;
            if (local_258.fpclass != cpp_dec_float_finite || local_258.data._M_elems[0] != 0) {
              result.m_backend.neg = (bool)(local_258.neg ^ 1);
            }
            tVar10 = boost::multiprecision::operator>
                               (&result,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&local_1c8);
            if (tVar10) {
              result_2.m_backend.data._M_elems[1] = local_258.data._M_elems[2];
              result_2.m_backend.data._M_elems[0] = local_258.data._M_elems[1];
              result_2.m_backend.data._M_elems[3] = local_258.data._M_elems[4];
              result_2.m_backend.data._M_elems[2] = local_258.data._M_elems[3];
              result_2.m_backend.data._M_elems[5] = local_258.data._M_elems[6];
              result_2.m_backend.data._M_elems[4] = local_258.data._M_elems[5];
              result_2.m_backend.data._M_elems._24_5_ =
                   SUB85(CONCAT44(local_258.data._M_elems[8],local_258.data._M_elems[7]),0);
              result_2.m_backend.data._M_elems[7]._1_3_ =
                   (undefined3)(local_258.data._M_elems[8] >> 8);
              result_2.m_backend.data._M_elems[8] = local_258.data._M_elems[9];
              local_1c8.data._M_elems[0] = 0;
              local_1c8.exp = local_258.exp;
              local_1c8.prec_elem = local_258.prec_elem;
              if (local_258.fpclass == cpp_dec_float_finite && local_258.data._M_elems[0] == 0) {
                local_1c8.neg = local_258.neg;
                local_1c8.fpclass = cpp_dec_float_finite;
              }
              else {
                local_1c8.neg = (bool)(local_258.neg ^ 1);
                local_1c8.data._M_elems[0] = local_258.data._M_elems[0];
                local_1c8.fpclass = local_258.fpclass;
              }
            }
            else {
              result_2.m_backend.data._M_elems[1] = local_1c8.data._M_elems[2];
              result_2.m_backend.data._M_elems[0] = local_1c8.data._M_elems[1];
              result_2.m_backend.data._M_elems[3] = local_1c8.data._M_elems[4];
              result_2.m_backend.data._M_elems[2] = local_1c8.data._M_elems[3];
              result_2.m_backend.data._M_elems[5] = local_1c8.data._M_elems[6];
              result_2.m_backend.data._M_elems[4] = local_1c8.data._M_elems[5];
              result_2.m_backend.data._M_elems._24_5_ =
                   SUB85(CONCAT44(local_1c8.data._M_elems[8],local_1c8.data._M_elems[7]),0);
              result_2.m_backend.data._M_elems[7]._1_3_ =
                   (undefined3)(local_1c8.data._M_elems[8] >> 8);
              result_2.m_backend.data._M_elems[8] = local_1c8.data._M_elems[9];
              local_1c8.fpclass = local_1c8.fpclass;
            }
            local_1c8.data._M_elems[9] = result_2.m_backend.data._M_elems[8];
            local_1c8.data._M_elems[5] = result_2.m_backend.data._M_elems[4];
            local_1c8.data._M_elems[6] = result_2.m_backend.data._M_elems[5];
            local_1c8.data._M_elems[7] = result_2.m_backend.data._M_elems[6];
            local_1c8.data._M_elems[8] =
                 (uint)(CONCAT35(result_2.m_backend.data._M_elems[7]._1_3_,
                                 result_2.m_backend.data._M_elems._24_5_) >> 0x20);
            local_1c8.data._M_elems[1] = result_2.m_backend.data._M_elems[0];
            local_1c8.data._M_elems[2] = result_2.m_backend.data._M_elems[1];
            local_1c8.data._M_elems[3] = result_2.m_backend.data._M_elems[2];
            local_1c8.data._M_elems[4] = result_2.m_backend.data._M_elems[3];
            puVar2 = (uint *)((long)local_d0 + lVar17 + -0x30);
            local_b8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            local_b8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)local_d0 + lVar17 + -0x20);
            local_b8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            uVar4 = *(undefined8 *)(puVar2 + 2);
            local_b8.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            uVar4 = *(undefined8 *)((long)local_d0 + lVar17 + -0x10);
            local_b8.data._M_elems._32_5_ = SUB85(uVar4,0);
            local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_b8.exp = *(int *)((long)local_d0 + lVar17 + -8);
            local_b8.neg = *(bool *)((long)local_d0 + lVar17 + -4);
            local_b8._48_8_ = *(undefined8 *)((long)local_d0 + lVar17);
            pdVar13 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&result.m_backend,-*pdVar13,(type *)0x0);
            tVar10 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_b8,&result);
            if (tVar10) {
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 10;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems._24_5_ = 0;
              result.m_backend.data._M_elems[7]._1_3_ = 0;
              result.m_backend.data._M_elems._32_5_ = 0;
              result.m_backend.data._M_elems[9]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result.m_backend,&local_b8,
                         (cpp_dec_float<50U,_int,_void> *)((long)&local_158->m_backend + lVar17));
              local_108.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
              local_108.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
              local_108.data._M_elems[4] = result.m_backend.data._M_elems[4];
              local_108.data._M_elems[5] = result.m_backend.data._M_elems[5];
              local_108.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
              local_108.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
              local_108.data._M_elems[0] = result.m_backend.data._M_elems[0];
              local_108.data._M_elems[1] = result.m_backend.data._M_elems[1];
              local_108.data._M_elems[2] = result.m_backend.data._M_elems[2];
              local_108.data._M_elems[3] = result.m_backend.data._M_elems[3];
              local_108.exp = result.m_backend.exp;
              local_108.neg = result.m_backend.neg;
              local_108.fpclass = result.m_backend.fpclass;
              local_108.prec_elem = result.m_backend.prec_elem;
              result.m_backend.data._M_elems._0_8_ =
                   result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
              tVar10 = boost::multiprecision::operator>=
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_108,(int *)&result);
              if (tVar10) {
                uVar4 = *(undefined8 *)((local_170->data)._M_elems + 8);
                result_2.m_backend.data._M_elems[8] = (uint)uVar4;
                result_2.m_backend.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
                result_2.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_170->data)._M_elems;
                result_2.m_backend.data._M_elems._8_8_ =
                     *(undefined8 *)((local_170->data)._M_elems + 2);
                result_2.m_backend.data._M_elems._16_8_ =
                     *(undefined8 *)((local_170->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((local_170->data)._M_elems + 6);
                result_2.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
                result_2.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                result_2.m_backend.exp = (local_188->fastDelta).m_backend.exp;
                result_2.m_backend.neg = (local_188->fastDelta).m_backend.neg;
                result_2.m_backend.fpclass = (local_188->fastDelta).m_backend.fpclass;
                result_2.m_backend.prec_elem = (local_188->fastDelta).m_backend.prec_elem;
                if (result_2.m_backend.fpclass != cpp_dec_float_finite ||
                    result_2.m_backend.data._M_elems[0] != 0) {
                  result_2.m_backend.neg = (bool)(result_2.m_backend.neg ^ 1);
                }
              }
              else {
                result_2.m_backend.fpclass = cpp_dec_float_finite;
                result_2.m_backend.prec_elem = 10;
                result_2.m_backend.data._M_elems[0] = 0;
                result_2.m_backend.data._M_elems[1] = 0;
                result_2.m_backend.data._M_elems[2] = 0;
                result_2.m_backend.data._M_elems[3] = 0;
                result_2.m_backend.data._M_elems[4] = 0;
                result_2.m_backend.data._M_elems[5] = 0;
                result_2.m_backend.data._M_elems._24_5_ = 0;
                result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                result_2.m_backend.data._M_elems[8] = 0;
                result_2.m_backend.data._M_elems[9] = 0;
                result_2.m_backend.exp = 0;
                result_2.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (&result_2.m_backend,&local_108,local_170);
              }
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 10;
              result.m_backend.neg = false;
              result.m_backend.exp = 0;
              result.m_backend.data._M_elems[9]._1_3_ = 0;
              result.m_backend.data._M_elems._32_5_ = 0;
              result.m_backend.data._M_elems[7]._1_3_ = 0;
              result.m_backend.data._M_elems._24_5_ = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              boost::multiprecision::default_ops::
              eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result.m_backend,&result_2.m_backend,&local_258);
              local_258.data._M_elems[8] = result.m_backend.data._M_elems[8];
              local_258.data._M_elems[9] =
                   (uint)(CONCAT35(result.m_backend.data._M_elems[9]._1_3_,
                                   result.m_backend.data._M_elems._32_5_) >> 0x20);
              local_258.data._M_elems[4] = result.m_backend.data._M_elems[4];
              local_258.data._M_elems[5] = result.m_backend.data._M_elems[5];
              local_258.data._M_elems[6] = result.m_backend.data._M_elems[6];
              local_258.data._M_elems[7] =
                   (uint)(CONCAT35(result.m_backend.data._M_elems[7]._1_3_,
                                   result.m_backend.data._M_elems._24_5_) >> 0x20);
              local_258.data._M_elems[0] = result.m_backend.data._M_elems[0];
              local_258.data._M_elems[1] = result.m_backend.data._M_elems[1];
              local_258.data._M_elems[2] = result.m_backend.data._M_elems[2];
              local_258.data._M_elems[3] = result.m_backend.data._M_elems[3];
              local_258.exp = result.m_backend.exp;
              local_258.neg = result.m_backend.neg;
              local_258.fpclass = result.m_backend.fpclass;
              local_258.prec_elem = result.m_backend.prec_elem;
              tVar10 = boost::multiprecision::operator<
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_258,&local_148);
              if (tVar10) {
                local_148.m_backend.data._M_elems[9] = local_258.data._M_elems[9];
                local_148.m_backend.data._M_elems[8] = local_258.data._M_elems[8];
                local_148.m_backend.data._M_elems[1] = local_258.data._M_elems[1];
                local_148.m_backend.data._M_elems[0] = local_258.data._M_elems[0];
                local_148.m_backend.data._M_elems[3] = local_258.data._M_elems[3];
                local_148.m_backend.data._M_elems[2] = local_258.data._M_elems[2];
                local_148.m_backend.data._M_elems[5] = local_258.data._M_elems[5];
                local_148.m_backend.data._M_elems[4] = local_258.data._M_elems[4];
                local_148.m_backend.data._M_elems[7] = local_258.data._M_elems[7];
                local_148.m_backend.data._M_elems[6] = local_258.data._M_elems[6];
                local_148.m_backend.exp = local_258.exp;
                local_148.m_backend.neg = local_258.neg;
                local_148.m_backend.fpclass = local_258.fpclass;
                local_148.m_backend.prec_elem = local_258.prec_elem;
                local_20c = (int)local_218;
              }
            }
          }
        }
      }
LAB_002460a3:
      local_218 = (int *)((long)local_218 + 1);
      local_168 = (int *)((long)local_168 + 8);
    }
    (local_178->thedelta).super_IdxSet.num =
         (int)((ulong)((long)local_260 - (long)(local_178->thedelta).super_IdxSet.idx) >> 2);
    (local_178->thedelta).setupStatus = true;
  }
  *(undefined8 *)((local_40->m_backend).data._M_elems + 8) =
       local_148.m_backend.data._M_elems._32_8_;
  *(undefined8 *)((local_40->m_backend).data._M_elems + 4) =
       local_148.m_backend.data._M_elems._16_8_;
  *(undefined8 *)((local_40->m_backend).data._M_elems + 6) =
       local_148.m_backend.data._M_elems._24_8_;
  *(undefined8 *)(local_40->m_backend).data._M_elems = local_148.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((local_40->m_backend).data._M_elems + 2) = local_148.m_backend.data._M_elems._8_8_
  ;
  (local_40->m_backend).exp = local_148.m_backend.exp;
  (local_40->m_backend).neg = local_148.m_backend.neg;
  (local_40->m_backend).fpclass = local_148.m_backend.fpclass;
  (local_40->m_backend).prec_elem = local_148.m_backend.prec_elem;
  *(ulong *)((local_38->m_backend).data._M_elems + 8) =
       CONCAT44(local_1c8.data._M_elems[9],local_1c8.data._M_elems[8]);
  *(ulong *)((local_38->m_backend).data._M_elems + 4) =
       CONCAT44(local_1c8.data._M_elems[5],local_1c8.data._M_elems[4]);
  *(ulong *)((local_38->m_backend).data._M_elems + 6) =
       CONCAT44(local_1c8.data._M_elems[7],local_1c8.data._M_elems[6]);
  *(ulong *)(local_38->m_backend).data._M_elems =
       CONCAT44(local_1c8.data._M_elems[1],local_1c8.data._M_elems[0]);
  *(ulong *)((local_38->m_backend).data._M_elems + 2) =
       CONCAT44(local_1c8.data._M_elems[3],local_1c8.data._M_elems[2]);
  (local_38->m_backend).exp = local_1c8.exp;
  (local_38->m_backend).neg = local_1c8.neg;
  (local_38->m_backend).fpclass = local_1c8.fpclass;
  (local_38->m_backend).prec_elem = local_1c8.prec_elem;
  return local_20c;
}

Assistant:

int SPxFastRT<R>::maxDelta(
   R& val,                                /* on return: maximum step length */
   R& maxabs,                             /* on return: maximum absolute value in upd VectorBase<R> */
   UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i, sel;
   R x, y, max;
   R u, l;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   R mabs = maxabs;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();

   sel = -1;
   max = val;

   if(update.delta().isSetup())
   {
      const int* last = idx + update.delta().size();

      for(idx += start; idx < last; idx += incr)
      {
         i = *idx;

         /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
         if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                        && this->thesolver->isBasic(i))))
            continue;

         if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
               && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
               == SPxBasisBase<R>::Desc::P_FIXED)
            continue;

         x = upd[i];

         if(x > epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (x > mabs) ? x : mabs;
            u = up[i];

            if(u < R(infinity))
            {
               y = u - vec[i];

               if(y <= 0)
                  x = fastDelta / x;
               else
                  x = (y + fastDelta) / x;

               if(x < max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
         else if(x < -epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (-x > mabs) ? -x : mabs;
            l = low[i];

            if(l > R(-infinity))
            {
               y = l - vec[i];

               if(y >= 0)
                  x = - fastDelta / x;
               else
                  x = (y - fastDelta) / x;

               if(x < max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
      }
   }
   else
   {
      /* In this case, the indices of the semi-sparse Vector update.delta() are not set up and are filled below. */
      int* l_idx = update.delta().altIndexMem();
      R* uval = update.delta().altValues();
      const R* uend = uval + update.dim();
      assert(uval == upd);

      for(i = 0; uval < uend; ++uval, ++i)
      {
         x = *uval;

         if(x != 0.0)
         {
            if(x >= -epsilonZero() && x <= epsilonZero())
            {
               *uval = 0.0;
               continue;
            }
            else
               *l_idx++ = i;

            /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
            if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                           && this->thesolver->isBasic(i))))
               continue;

            if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
                  && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
                  == SPxBasisBase<R>::Desc::P_FIXED)
               continue;

            if(x > epsilonZero())
            {
               mabs = (x > mabs) ? x : mabs;
               u = up[i];

               if(u < R(infinity))
               {
                  y = u - vec[i];

                  if(y <= 0)
                     x = fastDelta / x;
                  else
                     x = (y + fastDelta) / x;

                  if(x < max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
            else if(x < -epsilonZero())
            {
               mabs = (-x > mabs) ? -x : mabs;
               l = low[i];

               if(l > R(-infinity))
               {
                  y = l - vec[i];

                  if(y >= 0)
                     x = - fastDelta / x;
                  else
                     x = (y - fastDelta) / x;

                  if(x < max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
         }
      }

      update.delta().setSize(int(l_idx - update.delta().indexMem()));
      update.delta().forceSetup();
   }

   val = max;
   maxabs = mabs;
   return sel;
}